

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void CConsole::ConToggle(IResult *pResult,void *pUser)

{
  int iVar1;
  long lVar2;
  int iVar3;
  CCommand *pCVar4;
  undefined8 uVar5;
  CConsole *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int Val;
  CIntVariableData *pData;
  CCommand *pCommand;
  CConsole *pConsole;
  void *pUserData;
  FCommandCallback pfnCallback;
  char aBuf [128];
  int in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  char *pcVar6;
  CConsole *in_stack_ffffffffffffff18;
  uint local_d8;
  void *local_98;
  FCommandCallback local_90;
  char local_88 [64];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_88,0,0x80);
  (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  pCVar4 = FindCommand(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c
                      );
  if (pCVar4 == (CCommand *)0x0) {
    pcVar6 = local_88;
    uVar5 = (**(code **)(*in_RDI + 0x20))(in_RDI,0);
    str_format(pcVar6,0x80,"No such command: \'%s\'.",uVar5);
  }
  else {
    local_90 = pCVar4->m_pfnCallback;
    local_98 = pCVar4->m_pUserData;
    TraverseChain(in_RSI,&local_90,&local_98);
    if (local_90 == IntVariableCommand) {
      iVar1 = **(int **)((long)local_98 + 8);
      iVar3 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
      if (iVar1 == iVar3) {
        local_d8 = (**(code **)(*in_RDI + 0x10))(in_RDI,2);
      }
      else {
        local_d8 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
      }
      uVar5 = (**(code **)(*in_RDI + 0x20))(in_RDI,0);
      str_format(local_88,0x80,"%s %i",uVar5,(ulong)local_d8);
      (*(in_RSI->super_IConsole).super_IInterface._vptr_IInterface[0x13])(in_RSI,local_88);
      local_88[0] = '\0';
    }
    else {
      pcVar6 = local_88;
      uVar5 = (**(code **)(*in_RDI + 0x20))(in_RDI,0);
      str_format(pcVar6,0x80,"Invalid command: \'%s\'.",uVar5);
    }
  }
  if (local_88[0] != '\0') {
    (*(in_RSI->super_IConsole).super_IInterface._vptr_IInterface[0x19])(in_RSI,0,"console",local_88)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConsole::ConToggle(IConsole::IResult *pResult, void *pUser)
{
	CConsole *pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128] = {0};
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), pConsole->m_FlagMask);
	if(pCommand)
	{
		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		pConsole->TraverseChain(&pfnCallback, &pUserData);
		if(pfnCallback == IntVariableCommand)
		{
			CIntVariableData *pData = static_cast<CIntVariableData *>(pUserData);
			int Val = *(pData->m_pVariable)==pResult->GetInteger(1) ? pResult->GetInteger(2) : pResult->GetInteger(1);
			str_format(aBuf, sizeof(aBuf), "%s %i", pResult->GetString(0), Val);
			pConsole->ExecuteLine(aBuf);
			aBuf[0] = 0;
		}
		else
			str_format(aBuf, sizeof(aBuf), "Invalid command: '%s'.", pResult->GetString(0));
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));

	if(aBuf[0])
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}